

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lt.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint8_t *memory;
  int r;
  ulong uVar2;
  ulong uVar3;
  int n_ISIs;
  int local_88;
  int n_max_ISIs;
  uint32_t *ISIs;
  m256v M;
  parameters P;
  
  n_ISIs = 0;
  n_max_ISIs = 0x20;
  ISIs = (uint32_t *)malloc(0x80);
  local_88 = 0x3c;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = getopt(argc,argv,"hK:i:");
        if (iVar1 != 0x68) break;
        puts(
            "Tool to display an LT matrix.\n\n  -h       Display this help screen.\n  -K #     Set K value.\n  -i #,... Symbol identifiers (ESIs)."
            );
      }
      if (iVar1 != 0x69) break;
      parse_esis(&n_ISIs,&n_max_ISIs,&ISIs,_optarg);
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x4b) {
      local_88 = atoi(_optarg);
    }
    else if (iVar1 == 0x3f) {
      exit(1);
    }
  }
  parameters_get(local_88);
  iVar1 = n_ISIs;
  if (P.K == -1) {
    fwrite("Error:  Invalid choice of K.\n",0x1d,1,_stderr);
LAB_00101373:
    iVar1 = 1;
  }
  else {
    memory = (uint8_t *)malloc((long)(P.L * n_ISIs));
    m256v_make(&M,iVar1,P.L,memory);
    lt_generate_mat(&M,&P,n_ISIs,ISIs);
    for (uVar2 = 0; (long)uVar2 < (long)M.n_row; uVar2 = uVar2 + 1) {
      for (uVar3 = 0; (long)uVar3 < (long)M.n_col; uVar3 = uVar3 + 1) {
        iVar1 = 0x30;
        if (M.e[uVar3 + M.rstride * uVar2] != '\0') {
          if (M.e[uVar3 + M.rstride * uVar2] != '\x01') {
            fprintf(_stderr,"Error: Non-binary matrix entry seen, row=%d, col=%d\n",
                    uVar2 & 0xffffffff,uVar3 & 0xffffffff);
            goto LAB_00101373;
          }
          iVar1 = 0x31;
        }
        fputc(iVar1,_stdout);
      }
      fputc(10,_stdout);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
	int K = 60;
	int n_ISIs = 0;
	int n_max_ISIs = 32;
	uint32_t* ISIs = malloc(n_max_ISIs * sizeof(uint32_t));

	/* Read command line arguments */
	int c;
	while ((c = getopt(argc, argv, "hK:i:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			break;
		case 'K':
			K = atoi(optarg);
			break;
		case 'i': {
			parse_esis(&n_ISIs, &n_max_ISIs, &ISIs, optarg);
			break;
		}
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	/* Get parameters */
	parameters P = parameters_get(K);
	if (P.K == -1) {
		fprintf(stderr, "Error:  Invalid choice of K.\n");
		return 1;
	}

	/* Generate a suitable LT matrix */
	uint8_t* m = malloc(n_ISIs * P.L * sizeof(uint8_t));
	m256v M = m256v_make(n_ISIs, P.L, m);
	lt_generate_mat(&M, &P, n_ISIs, ISIs);

	/* Print on screen */
	for (int r = 0; r < M.n_row; ++r) {
		for (int c = 0; c < M.n_col; ++c) {
			switch (m256v_get_el(&M, r, c)) {
			case 0:		fputc('0', stdout);	break;
			case 1:		fputc('1', stdout);	break;
			default:
				fprintf(stderr, "Error: Non-binary matrix "
				  "entry seen, row=%d, col=%d\n", r, c);
				return 1;
			}
		}
		fputc('\n', stdout);
	}

	return 0;
}